

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O2

void __thiscall
ctemplate::TemplateDictionary::DictionaryPrinter::DumpVariables
          (DictionaryPrinter *this,VariableDict *dict)

{
  bool bVar1;
  uint uVar2;
  mapped_type *this_00;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  TemplateString *ts;
  TemplateString *ts_00;
  const_iterator it;
  string local_1a0;
  TemplateString key;
  string local_160;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  string local_100;
  string local_e0;
  string local_c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sorted_variable_dict;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  sorted_variable_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sorted_variable_dict._M_t._M_impl.super__Rb_tree_header._M_header;
  sorted_variable_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sorted_variable_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sorted_variable_dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar2 = dict->size_;
  it.hash_iter_._M_node = (_Base_ptr)0x0;
  it.array_iter_ =
       (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)
       &dict->field_2;
  if ((int)uVar2 < 0) {
    it.hash_iter_._M_node = *(_Base_ptr *)((long)&dict->field_2 + 0x20);
    it.array_iter_ =
         (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)
         (anon_union_160_3_1f8f2db0_for_small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>_6
          *)0x0;
  }
  sorted_variable_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sorted_variable_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    key.ptr_ = (char *)((ulong)uVar2 * 0x28 + (long)&dict->field_2);
    if ((int)uVar2 < 0) {
      key.ptr_ = (char *)0x0;
      key.length_ = (size_t)((long)&dict->field_2 + 0x10);
    }
    else {
      key.length_ = 0;
    }
    bVar1 = small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
            ::const_iterator::operator!=(&it,(const_iterator *)&key);
    if (!bVar1) break;
    p_Var4 = it.hash_iter_._M_node + 1;
    if (it.array_iter_ !=
        (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)0x0) {
      p_Var4 = (_Base_ptr)it.array_iter_;
    }
    TemplateString::IdToString(&key,*(TemplateId *)p_Var4);
    if (key.ptr_ == (char *)0x0) {
      __assert_fail("!InvalidTemplateString(key)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                    ,0x314,
                    "void ctemplate::TemplateDictionary::DictionaryPrinter::DumpVariables(const VariableDict &)"
                   );
    }
    p_Var4 = it.hash_iter_._M_node + 1;
    if (it.array_iter_ !=
        (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)0x0) {
      p_Var4 = (_Base_ptr)it.array_iter_;
    }
    PrintableTemplateString_abi_cxx11_(&local_c0,(TemplateDictionary *)&p_Var4->_M_parent,ts);
    PrintableTemplateString_abi_cxx11_(&local_50,(TemplateDictionary *)&key,ts_00);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&sorted_variable_dict,&local_50);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_c0);
    small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
    ::const_iterator::operator++(&it);
    uVar2 = dict->size_;
  }
  for (p_Var3 = sorted_variable_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &sorted_variable_dict._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::operator+(&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1)
                   ,": >");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key,
                   &local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 2)
                  );
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key,"<\n");
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    local_1a0._M_string_length = 0;
    local_1a0.field_2._M_local_buf[0] = '\0';
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    local_100._M_string_length = 0;
    local_120._0_8_ = local_120 + 0x10;
    local_120._8_8_ = (char *)0x0;
    local_140._0_8_ = local_140 + 0x10;
    local_140._8_8_ = (IncludeDict *)0x0;
    local_100.field_2._M_local_buf[0] = '\0';
    local_120[0x10] = '\0';
    local_140[0x10] = '\0';
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    local_160._M_string_length = 0;
    local_160.field_2._M_local_buf[0] = '\0';
    IndentedWriter::Write
              (&this->writer_,&local_70,&local_1a0,&local_e0,&local_100,(string *)local_120,
               (string *)local_140,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)local_140);
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&key);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&sorted_variable_dict._M_t);
  return;
}

Assistant:

void DumpVariables(const VariableDict& dict) {
    map<string, string> sorted_variable_dict;
    for (VariableDict::const_iterator it = dict.begin();
         it != dict.end();  ++it) {
      const TemplateString key = TemplateDictionary::IdToString(it->first);
      assert(!InvalidTemplateString(key));  // checks key.ptr_ != NULL
      sorted_variable_dict[PrintableTemplateString(key)] =
          PrintableTemplateString(it->second);
    }
    for (map<string,string>::const_iterator it = sorted_variable_dict.begin();
         it != sorted_variable_dict.end();  ++it) {
      writer_.Write(it->first + ": >" + it->second + "<\n");
    }
  }